

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void env_arr_new(char *identifer,int line,long numElements,Environment *env)

{
  Object value;
  Record *pRVar1;
  Object *pOVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  long lVar6;
  bool bVar7;
  Object o;
  undefined4 uStack_64;
  undefined4 uStack_5c;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  pRVar1 = env_match(identifer,env);
  if (pRVar1 != (Record *)0x0) {
    if ((pRVar1->object).type == OBJECT_ARRAY) {
      lVar6 = (long)(pRVar1->object).field_1.literal.line;
      (pRVar1->object).field_1.literal.line = (int)numElements;
      pOVar2 = (Object *)realloc((pRVar1->object).field_1.arr.values,numElements << 6);
      (pRVar1->object).field_1.arr.values = pOVar2;
      lVar3 = lVar6 << 6;
      for (; lVar6 < numElements; lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)&((pRVar1->object).field_1.arr.values)->type + lVar3) = 0;
        lVar3 = lVar3 + 0x40;
      }
      return;
    }
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Variable %s is already defined!\x1b[0m",line,
           identifer);
  }
  puVar4 = (undefined4 *)malloc(numElements << 6);
  puVar5 = puVar4;
  lVar3 = 0;
  if (0 < numElements) {
    lVar3 = numElements;
  }
  while (bVar7 = lVar3 != 0, lVar3 = lVar3 + -1, bVar7) {
    *puVar5 = 0;
    puVar5 = puVar5 + 0x10;
  }
  value._4_4_ = uStack_64;
  value.type = 2;
  value.field_1.literal.type = uStack_5c;
  value.field_1.literal.line = (int)numElements;
  value.field_1.arr.values = (Object *)puVar4;
  value.field_1._16_8_ = uStack_50;
  value.field_1.routine.arguments = (char **)local_48;
  value.field_1._32_8_ = uStack_40;
  value.field_1.container.constructor.statements = (Statement *)local_38;
  value.field_1.routine.code.statements = (Statement *)uStack_30;
  rec_new(identifer,value,env);
  return;
}

Assistant:

void env_arr_new(char *identifer, int line, long numElements, Environment *env){
    Record *match = env_match(identifer, env);
    if(match != NULL && match->object.type != OBJECT_ARRAY)
        printf(runtime_error("Variable %s is already defined!"), line, identifer);
    else if(match != NULL){
        long bak = match->object.arr.count;
        match->object.arr.count = numElements;
        match->object.arr.values = (Object *)reallocate(match->object.arr.values, sizeof(Object)*numElements);
        while(bak < numElements){
            match->object.arr.values[bak].type = OBJECT_NULL;
            bak++;
        }
        return;
    }
    Object o;
    o.type = OBJECT_ARRAY;
    o.arr.count = numElements;
    o.arr.values = (Object *)mallocate(sizeof(Object) * numElements);
    long i = 0;
    while(i < numElements){
        o.arr.values[i].type = OBJECT_NULL;
        i++;
    }
    rec_new(identifer, o, env);
}